

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testBox.cpp
# Opt level: O0

void (anonymous_namespace)::testConstructors<Imath_3_2::Vec2<short>>(char *type)

{
  bool bVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  short *psVar6;
  char *in_RDI;
  Box<Imath_3_2::Vec2<short>_> b_2;
  uint i_1;
  Vec2<short> p1;
  Vec2<short> p0;
  Box<Imath_3_2::Vec2<short>_> b_1;
  uint i;
  Vec2<short> p;
  Box<Imath_3_2::Vec2<short>_> b;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  bool bVar7;
  short in_stack_ffffffffffffffa0;
  short in_stack_ffffffffffffffa2;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa8;
  undefined1 uVar8;
  short in_stack_ffffffffffffffaa;
  uint uVar9;
  Box<Imath_3_2::Vec2<short>_> *in_stack_ffffffffffffffb0;
  bool local_3d;
  Vec2<short> local_3c;
  Vec2<short> VStack_38;
  uint local_34;
  Vec2<short> local_30;
  Vec2<short> local_2c;
  Vec2<short> local_28;
  Vec2<short> VStack_24;
  uint local_20;
  Vec2<short> local_1c;
  Vec2<short> local_18;
  Vec2<short> local_14;
  Vec2<short> local_10;
  undefined1 auStack_c [12];
  
  auStack_c._4_8_ = in_RDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"    constructors for type ");
  poVar5 = std::operator<<(poVar5,(char *)auStack_c._4_8_);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
            ((Box<Imath_3_2::Vec2<short>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,
                      CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)));
  sVar2 = Imath_3_2::Vec2<short>::baseTypeMax();
  Imath_3_2::Vec2<short>::Vec2(&local_14,sVar2);
  bVar1 = Imath_3_2::Vec2<short>::operator==(&local_10,&local_14);
  local_3d = false;
  if (bVar1) {
    in_stack_ffffffffffffffb0 = (Box<Imath_3_2::Vec2<short>_> *)auStack_c;
    sVar2 = Imath_3_2::Vec2<short>::baseTypeLowest();
    Imath_3_2::Vec2<short>::Vec2(&local_18,sVar2);
    local_3d = Imath_3_2::Vec2<short>::operator==(&in_stack_ffffffffffffffb0->min,&local_18);
  }
  if (local_3d == false) {
    __assert_fail("b.min == T (T::baseTypeMax ()) && b.max == T (T::baseTypeLowest ())",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x58,
                  "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec2<short>]"
                 );
  }
  Imath_3_2::Vec2<short>::Vec2(&local_1c);
  local_20 = 0;
  while (uVar9 = local_20, uVar3 = Imath_3_2::Vec2<short>::dimensions(), uVar9 < uVar3) {
    in_stack_ffffffffffffffaa = (short)local_20;
    psVar6 = Imath_3_2::Vec2<short>::operator[](&local_1c,local_20);
    *psVar6 = in_stack_ffffffffffffffaa;
    local_20 = local_20 + 1;
  }
  Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
            ((Box<Imath_3_2::Vec2<short>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,
                      CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)),
             (Vec2<short> *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
  bVar1 = Imath_3_2::Vec2<short>::operator==(&local_28,&local_1c);
  uVar8 = false;
  if (bVar1) {
    uVar8 = Imath_3_2::Vec2<short>::operator==(&VStack_24,&local_1c);
  }
  if ((bool)uVar8 != false) {
    Imath_3_2::Vec2<short>::Vec2(&local_2c);
    Imath_3_2::Vec2<short>::Vec2(&local_30);
    local_34 = 0;
    while (uVar3 = local_34, uVar4 = Imath_3_2::Vec2<short>::dimensions(), uVar3 < uVar4) {
      in_stack_ffffffffffffffa0 = (short)local_34;
      psVar6 = Imath_3_2::Vec2<short>::operator[](&local_2c,local_34);
      *psVar6 = in_stack_ffffffffffffffa0;
      uVar3 = Imath_3_2::Vec2<short>::dimensions();
      in_stack_ffffffffffffffa2 = ((short)uVar3 * 10 - (short)local_34) + -1;
      psVar6 = Imath_3_2::Vec2<short>::operator[](&local_30,local_34);
      *psVar6 = in_stack_ffffffffffffffa2;
      local_34 = local_34 + 1;
    }
    Imath_3_2::Box<Imath_3_2::Vec2<short>_>::Box
              (in_stack_ffffffffffffffb0,
               (Vec2<short> *)
               CONCAT44(uVar9,CONCAT22(in_stack_ffffffffffffffaa,
                                       CONCAT11(uVar8,in_stack_ffffffffffffffa8))),
               (Vec2<short> *)
               CONCAT44(uVar3,CONCAT22(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0)));
    bVar1 = Imath_3_2::Vec2<short>::operator==(&local_3c,&local_2c);
    bVar7 = false;
    if (bVar1) {
      bVar7 = Imath_3_2::Vec2<short>::operator==(&VStack_38,&local_30);
    }
    if (bVar7 != false) {
      return;
    }
    __assert_fail("b.min == p0 && b.max == p1",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                  ,0x74,
                  "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec2<short>]"
                 );
  }
  __assert_fail("b.min == p && b.max == p",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testBox.cpp"
                ,100,
                "void (anonymous namespace)::testConstructors(const char *) [T = Imath_3_2::Vec2<short>]"
               );
}

Assistant:

static void
testConstructors (const char* type)
{
    cout << "    constructors for type " << type << endl;

    //
    // Empty
    //
    {
        IMATH_INTERNAL_NAMESPACE::Box<T> b;
        assert (
            b.min == T (T::baseTypeMax ()) &&
            b.max == T (T::baseTypeLowest ()));
    }

    //
    // Single point
    //
    {
        T p;
        for (unsigned int i = 0; i < T::dimensions (); i++)
            p[i] = static_cast<typename T::BaseType>(i);

        IMATH_INTERNAL_NAMESPACE::Box<T> b (p);
        assert (b.min == p && b.max == p);
    }

    //
    // Min and max
    //
    {
        T p0;
        T p1;
        for (unsigned int i = 0; i < T::dimensions (); i++)
        {
            p0[i] = static_cast<typename T::BaseType>(i);
            p1[i] = static_cast<typename T::BaseType>(10 * T::dimensions () - i - 1);
        }

        IMATH_INTERNAL_NAMESPACE::Box<T> b (p0, p1);
        assert (b.min == p0 && b.max == p1);
    }
}